

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GrcManager::DebugXmlGlyphs(GrcManager *this,GrcFont *pfont,ofstream *strmOut,string *staPathToCur)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  GrcSymbolTable *pGVar4;
  GrcSymbolTableEntry *pGVar5;
  GdlRenderer *this_00;
  pointer pcVar6;
  GrcGlyphAttrMatrix *pGVar7;
  size_t __n;
  pointer pGVar8;
  gid16 wGlyphID;
  bool bVar9;
  int iVar10;
  int iVar11;
  Symbol pGVar12;
  pointer ppGVar13;
  ostream *poVar14;
  utf16 *rgchwUniToGlyphID;
  char *pcVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar16;
  ulong uVar17;
  uint uVar18;
  bool fShadow;
  bool fOverride;
  uint *local_298;
  ulong local_290;
  string local_288;
  string staExpType;
  vector<int,_std::allocator<int>_> vnSingleMemberClassLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vstaSingleMemberClassFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vstaSingleMemberClasses;
  string local_1c0;
  long *local_1a0;
  size_t local_198;
  long local_190 [2];
  int munitPR;
  int nPR;
  string local_178;
  string local_158;
  string local_138;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwXPsdForUni;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vnXUniForPsd;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  GdlExpression *pexp;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"  <glyphAttrs>\n",0xf);
  pGVar4 = this->m_psymtbl;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"*actualForPseudo*","");
  pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  uVar1 = pGVar12->m_nInternalID;
  pGVar4 = this->m_psymtbl;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"breakweight","");
  pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  uVar18 = pGVar12->m_nInternalID;
  pGVar4 = this->m_psymtbl;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"directionality","");
  pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  uVar2 = pGVar12->m_nInternalID;
  if (this->m_fPassOptimizations == true) {
    pGVar4 = this->m_psymtbl;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"*skipPasses*","");
    pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_298 = (uint *)CONCAT44(local_298._4_4_,pGVar12->m_nInternalID);
    pGVar4 = this->m_psymtbl;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"*skipPasses2*","");
    pGVar12 = GrcSymbolTable::FindSymbol(pGVar4,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (pGVar12 == (Symbol)0x0) {
      local_290 = 0;
    }
    else {
      local_290 = (ulong)(uint)pGVar12->m_nInternalID;
    }
  }
  else {
    local_290 = 0;
    local_298 = (uint *)((ulong)local_298 & 0xffffffff00000000);
  }
  pGVar4 = this->m_psymtbl;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"justify","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"stretch","");
  GrcStructName::GrcStructName((GrcStructName *)&staExpType,&local_138,&local_158);
  GrcSymbolTable::FindSymbol(pGVar4,(GrcStructName *)&staExpType);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&staExpType);
  uVar16 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    uVar16 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    uVar16 = extraout_RDX_01;
  }
  ppGVar13 = (this->m_vpsymGlyphAttrs).
             super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vpsymGlyphAttrs).
      super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar13) {
    local_298 = (uint *)((ulong)local_298 & 0xffffffff);
    uVar17 = 0;
    do {
      pGVar5 = ppGVar13[uVar17];
      if ((int)uVar17 == pGVar5->m_nInternalID) {
        ExpressionDebugString_abi_cxx11_
                  (&staExpType,(GrcManager *)(ulong)pGVar5->m_expt,(ExpressionType)uVar16);
        pcVar15 = "bw";
        if (((uVar18 == uVar17) || (pcVar15 = "dircode", uVar2 == uVar17)) ||
           (pcVar15 = "gid", uVar1 == uVar17)) {
LAB_001195f7:
          std::__cxx11::string::_M_replace
                    ((ulong)&staExpType,0,(char *)staExpType._M_string_length,(ulong)pcVar15);
        }
        else {
          if (local_298 == (uint *)uVar17) {
            pcVar15 = "bitmap";
            goto LAB_001195f7;
          }
          pcVar15 = "bitmap";
          if (local_290 == uVar17) goto LAB_001195f7;
          bVar9 = GrcSymbolTableEntry::IsPointField(pGVar5);
          pcVar15 = "point";
          if (bVar9) goto LAB_001195f7;
          bVar9 = GrcSymbolTableEntry::IsComponentBoxField(pGVar5);
          pcVar15 = "comp";
          if (bVar9) goto LAB_001195f7;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)strmOut,"    <glyphAttr name=\"",0x15);
        GrcSymbolTableEntry::FullName_abi_cxx11_(&local_288,pGVar5);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)strmOut,local_288._M_dataplus._M_p,
                             local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" attrId=\"",10);
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" type=\"",8);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,staExpType._M_dataplus._M_p,staExpType._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" />\n",5);
        uVar16 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          uVar16 = extraout_RDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)staExpType._M_dataplus._M_p != &staExpType.field_2) {
          operator_delete(staExpType._M_dataplus._M_p,staExpType.field_2._M_allocated_capacity + 1);
          uVar16 = extraout_RDX_04;
        }
      }
      uVar17 = uVar17 + 1;
      ppGVar13 = (this->m_vpsymGlyphAttrs).
                 super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(this->m_vpsymGlyphAttrs).
                                    super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar13 >> 3
                             ));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"  </glyphAttrs>\n\n",0x11);
  iVar3 = pfont->m_cnUnicode;
  uVar17 = 0xffffffffffffffff;
  if (-1 < (long)iVar3) {
    uVar17 = (long)iVar3 * 2;
  }
  rgchwUniToGlyphID = (utf16 *)operator_new__(uVar17);
  local_298 = (uint *)operator_new__(0x40000);
  vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CmapAndInverse(this,pfont,iVar3,rgchwUniToGlyphID,local_298,&vnXUniForPsd,&vwXPsdForUni);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"  <glyphs>\n",0xb);
  vstaSingleMemberClasses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vstaSingleMemberClasses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vstaSingleMemberClasses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vstaSingleMemberClassFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vstaSingleMemberClassFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vstaSingleMemberClassFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = this->m_prndr;
  pcVar6 = (staPathToCur->_M_dataplus)._M_p;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar6,pcVar6 + staPathToCur->_M_string_length);
  GdlRenderer::RecordSingleMemberClasses
            (this_00,&vstaSingleMemberClasses,&vstaSingleMemberClassFiles,&vnSingleMemberClassLines,
             &local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (this->m_cwGlyphIDs != 0) {
    iVar3 = this->m_fxdGlatTableVersion;
    uVar17 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)strmOut,"    <glyph glyphid=\"",0x14);
      std::ostream::_M_insert<unsigned_long>((ulong)strmOut);
      if (uVar17 < (ulong)((long)vstaSingleMemberClasses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)vstaSingleMemberClasses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        iVar10 = std::__cxx11::string::compare
                           ((char *)(vstaSingleMemberClasses.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar17));
        if (iVar10 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)strmOut,"\" className=\"",0xd);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)strmOut,
                     vstaSingleMemberClasses.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p,
                     vstaSingleMemberClasses.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_string_length);
        }
      }
      uVar18 = local_298[uVar17];
      if (uVar18 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" usv=\"",7);
        DebugUnicode((ostream *)strmOut,uVar18,false);
      }
      if (uVar17 < (ulong)((long)vstaSingleMemberClassFiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)vstaSingleMemberClassFiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        iVar10 = std::__cxx11::string::compare
                           ((char *)(vstaSingleMemberClassFiles.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar17));
        if (iVar10 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" inFile=\"",10);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)strmOut,
                               vstaSingleMemberClassFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p,
                               vstaSingleMemberClassFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" atLine=\"",10);
          std::ostream::operator<<
                    (poVar14,vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar17]);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,">\n",2);
      local_290 = uVar17;
      if ((this->m_vpsymGlyphAttrs).
          super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->m_vpsymGlyphAttrs).
          super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_290._0_2_ = (gid16)uVar17;
        wGlyphID = (gid16)local_290;
        uVar17 = 0;
        do {
          uVar18 = (uint)uVar17;
          iVar10 = FinalAttrValue(this,wGlyphID,uVar18);
          if ((uVar1 != uVar18 || iVar10 != 0) &&
             ((bVar9 = GrcSymbolTableEntry::IsMirrorAttr
                                 ((this->m_vpsymGlyphAttrs).
                                  super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar17]),
              !bVar9 && uVar2 != uVar18 || (0 < this->m_prndr->m_nBidi)))) {
            staExpType._M_dataplus._M_p = (pointer)0xffffffffffffffff;
            staExpType._M_string_length = (long)&staExpType.field_2 + 8;
            staExpType.field_2._M_allocated_capacity = 0;
            staExpType.field_2._M_local_buf[8] = '\0';
            GrcGlyphAttrMatrix::Get
                      (this->m_pgax,wGlyphID,uVar18,0,&pexp,&nPR,&munitPR,&fOverride,&fShadow,
                       (GrpLineAndFile *)&staExpType);
            if ((this->m_vpsymGlyphAttrs).
                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar17]->m_fUserDefined == true) {
              pGVar7 = this->m_pgax;
              if ((pGVar7->m_cStyles != 0 &&
                   (pGVar7->m_cGlyphIDs != 0 && pGVar7->m_cGlyphAttrs != 0)) &&
                 (pGVar7->m_prgasgnx
                  [(int)((int)pGVar7->m_cStyles *
                        ((int)pGVar7->m_cGlyphAttrs * (uint)wGlyphID + uVar18))].m_pexp !=
                  (GdlExpression *)0x0)) goto LAB_00119b73;
            }
            else {
LAB_00119b73:
              bVar9 = GdlRenderer::HasCollisionPass(this->m_prndr);
              if ((bVar9) ||
                 (bVar9 = GrcSymbolTableEntry::IsCollisionAttr
                                    ((this->m_vpsymGlyphAttrs).
                                     super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar17]), !bVar9)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)strmOut,"      <glyphAttrValue name=\"",0x1c);
                GrcSymbolTableEntry::FullName_abi_cxx11_
                          (&local_288,
                           (this->m_vpsymGlyphAttrs).
                           super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17]);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)strmOut,local_288._M_dataplus._M_p,
                                     local_288._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" value=\"",9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  local_288.field_2._M_allocated_capacity + 1);
                }
                pGVar5 = (this->m_vpsymGlyphAttrs).
                         super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17];
                local_1a0 = local_190;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"gpoint","");
                __n = (pGVar5->m_staFieldName)._M_string_length;
                if (__n == local_198) {
                  if (__n == 0) {
                    bVar9 = true;
                  }
                  else {
                    iVar11 = bcmp((pGVar5->m_staFieldName)._M_dataplus._M_p,local_1a0,__n);
                    bVar9 = iVar11 == 0;
                  }
                }
                else {
                  bVar9 = false;
                }
                if (local_1a0 != local_190) {
                  operator_delete(local_1a0,local_190[0] + 1);
                }
                if ((bool)(iVar10 == -2 & bVar9)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"zero",4);
                }
                else {
                  std::ostream::operator<<(strmOut,iVar10);
                }
                if ((int)staExpType._M_dataplus._M_p != -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)strmOut,"\" inFile=\"",10);
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  pcVar6 = (staPathToCur->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1c0,pcVar6,pcVar6 + staPathToCur->_M_string_length);
                  GrpLineAndFile::FileWithPath(&local_288,(GrpLineAndFile *)&staExpType,&local_1c0);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)strmOut,local_288._M_dataplus._M_p,
                                       local_288._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" atLine=\"",10);
                  std::ostream::operator<<(poVar14,staExpType._M_dataplus._M_p._4_4_);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_288._M_dataplus._M_p != &local_288.field_2) {
                    operator_delete(local_288._M_dataplus._M_p,
                                    local_288.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"\" />\n",5);
              }
            }
            if ((undefined1 *)staExpType._M_string_length !=
                (undefined1 *)((long)&staExpType.field_2 + 8)) {
              operator_delete((void *)staExpType._M_string_length,
                              CONCAT71(staExpType.field_2._9_7_,staExpType.field_2._M_local_buf[8])
                              + 1);
            }
          }
          uVar17 = (ulong)(uVar18 + 1);
        } while (uVar17 < (ulong)((long)(this->m_vpsymGlyphAttrs).
                                        super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_vpsymGlyphAttrs).
                                        super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      uVar18 = (uint)local_290;
      if (((0x2ffff < iVar3) && (uVar18 < this->m_wGlyphIDLim)) &&
         (pGVar8 = (this->m_vgbdy).
                   super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>._M_impl.
                   super__Vector_impl_data._M_start,
         uVar18 < (uint)((int)((ulong)((long)(this->m_vgbdy).
                                             super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pGVar8) >> 7) * -0x3b13b13b))) {
        GlyphBoundaries::DebugXml(pGVar8 + local_290,strmOut);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"    </glyph>\n",0xd);
      uVar17 = (ulong)(uVar18 + 1);
    } while (uVar17 < this->m_cwGlyphIDs);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"  </glyphs>\n\n",0xd);
  if (vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vnSingleMemberClassLines.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vstaSingleMemberClassFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vstaSingleMemberClasses);
  if (vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vwXPsdForUni.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vwXPsdForUni.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vwXPsdForUni.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vnXUniForPsd.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vnXUniForPsd.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vnXUniForPsd.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GrcManager::DebugXmlGlyphs(GrcFont * pfont, std::ofstream & strmOut,
	std::string staPathToCur)
{
	// Glyph attribute definitions

	strmOut << "  <glyphAttrs>\n";

	Symbol psymActual = m_psymtbl->FindSymbol("*actualForPseudo*");
	unsigned int nAttrIdActual = psymActual->InternalID();
	Symbol psymBw = m_psymtbl->FindSymbol("breakweight");
	unsigned int nAttrIdBw = psymBw->InternalID();
	Symbol psymDir = m_psymtbl->FindSymbol("directionality");
	unsigned int nAttrIdDir = psymDir->InternalID();
	Symbol psymSkipP = NULL;
	unsigned int nAttrIdSkipP = 0;
	Symbol psymSkipP2 = NULL;
	unsigned int nAttrIdSkipP2 = 0;
	if (this->IncludePassOptimizations())
	{
		psymSkipP = m_psymtbl->FindSymbol("*skipPasses*");
		nAttrIdSkipP = psymSkipP->InternalID();
		psymSkipP2 = m_psymtbl->FindSymbol("*skipPasses2*");
		if (psymSkipP2)
			nAttrIdSkipP2 = psymSkipP2->InternalID();
	}

	//Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "0", "stretch"));
	Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "stretch"));
	int nAttrIdJStr = psymJStr->InternalID();

	for (size_t nAttrID = 0; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
	{
		Symbol psymGlyphAttr = m_vpsymGlyphAttrs[nAttrID];

		//if ((psymGlyphAttr->IsMirrorAttr() || nAttrID == nAttrIdDir)
		//		&& !m_prndr->Bidi())
		//	continue;

		if (psymGlyphAttr->InternalID() == static_cast<int>(nAttrID))
		{
			std::string staExpType = ExpressionDebugString(psymGlyphAttr->ExpType());
			if (nAttrID == nAttrIdBw)
				staExpType = "bw";
			else if (nAttrID == nAttrIdDir)
				staExpType = "dircode";
			else if (nAttrID == nAttrIdActual)
				staExpType = "gid";
			else if (nAttrID == nAttrIdSkipP || nAttrID == nAttrIdSkipP2)
				staExpType = "bitmap";
			else if (psymGlyphAttr->IsPointField())
				staExpType = "point";
			else if (psymGlyphAttr->IsComponentBoxField())
				staExpType = "comp";

			strmOut << "    <glyphAttr name=\"" << psymGlyphAttr->FullName() 
				<< "\" attrId=\"" << nAttrID 
				<< "\" type=\"" << staExpType
				<< "\" />\n";
		}
		// else we have something like justify.stretch which is unused
	}

	strmOut << "  </glyphAttrs>\n\n";

	// Glyphs and their attribute values

	// Generate the cmap.
	int cnUni = pfont->NumUnicode();
	utf16 * rgchwUniToGlyphID = new utf16[cnUni];
	unsigned int * rgnGlyphIDToUni = new unsigned int[0x10000];
	std::vector<unsigned int> vnXUniForPsd;
	std::vector<utf16> vwXPsdForUni;
	CmapAndInverse(pfont, cnUni, rgchwUniToGlyphID, rgnGlyphIDToUni,
		vnXUniForPsd, vwXPsdForUni);

	strmOut << "  <glyphs>\n";

	std::vector<std::string> vstaSingleMemberClasses;
	std::vector<std::string> vstaSingleMemberClassFiles;
	std::vector<int> vnSingleMemberClassLines;
	m_prndr->RecordSingleMemberClasses(vstaSingleMemberClasses,
		vstaSingleMemberClassFiles, vnSingleMemberClassLines, staPathToCur);

	int fxdGlatVersion = TableVersion(ktiGlat);

	for (auto wGlyphID = 0U; wGlyphID < m_cwGlyphIDs; wGlyphID++)
	{
		// Convert breakweight values depending on the table version to output.
		////ConvertBwForVersion(wGlyphID, nAttrIdBw);

		//	Split any large stretch values into two 16-bit words.
		////SplitLargeStretchValue(wGlyphID, nAttrIdJStr);

		strmOut << "    <glyph glyphid=\"" << wGlyphID;
		if (vstaSingleMemberClasses.size() > (unsigned)wGlyphID && vstaSingleMemberClasses[wGlyphID] != "")
			strmOut << "\" className=\"" << vstaSingleMemberClasses[wGlyphID];
		if (rgnGlyphIDToUni[wGlyphID] != 0)
		{
			strmOut << "\" usv=\""; 
			DebugUnicode(strmOut, rgnGlyphIDToUni[wGlyphID], false);
		}
		if (vstaSingleMemberClassFiles.size() > (unsigned)wGlyphID && vstaSingleMemberClassFiles[wGlyphID] != "")
			strmOut << "\" inFile=\"" << vstaSingleMemberClassFiles[wGlyphID]
				<< "\" atLine=\"" << vnSingleMemberClassLines[wGlyphID];
		strmOut<< "\"" << ">\n";
	
		for (auto nAttrID = 0U; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
		{
			int nValue = FinalAttrValue(wGlyphID, nAttrID);

			if (nAttrID == nAttrIdActual && nValue == 0)
				continue;

			if ((m_vpsymGlyphAttrs[nAttrID]->IsMirrorAttr() || nAttrID == nAttrIdDir)
					&& m_prndr->Bidi() == 0)
				// Ignore mirror and directionality attribute for non-bidi.
				continue;

			// Get the original expression where this attribute was set.
			GdlExpression * pexp;
			int nPR;
			int munitPR;
			bool fOverride, fShadow;
			GrpLineAndFile lnf;
			m_pgax->Get(wGlyphID, nAttrID,
				&pexp, &nPR, &munitPR, &fOverride, &fShadow, &lnf);

			if (m_vpsymGlyphAttrs[nAttrID]->IsUserDefined() && !m_pgax->Defined(wGlyphID, nAttrID))
				// Attribute not defined for this glyph.
				continue;

			if (! m_prndr->HasCollisionPass() && m_vpsymGlyphAttrs[nAttrID]->IsCollisionAttr())
				// Ignore collision attributes when there is no collision pass.
				continue;

			strmOut << "      <glyphAttrValue name=\"" << m_vpsymGlyphAttrs[nAttrID]->FullName()
				<< "\" value=\"";
			if (m_vpsymGlyphAttrs[nAttrID]->LastFieldIs("gpoint") && nValue == kGpointZero)
				strmOut << "zero";
			else
				strmOut  << nValue;

			if (!lnf.NotSet())
				strmOut << "\" inFile=\"" << lnf.FileWithPath(staPathToCur)
					<< "\" atLine=\"" << lnf.OriginalLine();

			strmOut << "\" />\n";
		}

		if (fxdGlatVersion >= 0x00030000)
		{
			// Output glyph-approximation octaboxes.
			if (wGlyphID < m_wGlyphIDLim && wGlyphID < (int)m_vgbdy.size())
				m_vgbdy[wGlyphID].DebugXml(strmOut);
		}

		strmOut << "    </glyph>\n";
	}

	strmOut << "  </glyphs>\n\n";
}